

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_ALSA.c
# Opt level: O3

UINT8 WriteBuffer(DRV_ALSA *drv,UINT32 dataSize,void *data)

{
  UINT8 UVar1;
  int iVar2;
  
  do {
    iVar2 = snd_pcm_writei(drv->hPCM,data,(ulong)dataSize / (ulong)(drv->waveFmt).nBlockAlign);
  } while (iVar2 == -0xb);
  if (iVar2 != -0x20) {
    if (iVar2 == -0x56) {
      while( true ) {
        iVar2 = snd_pcm_resume(drv->hPCM);
        if (iVar2 != -0xb) break;
        usleep(1000);
      }
      if (iVar2 < 0) goto LAB_001115a8;
    }
    return (UINT8)iVar2;
  }
LAB_001115a8:
  UVar1 = snd_pcm_prepare(drv->hPCM);
  return UVar1;
}

Assistant:

static UINT8 WriteBuffer(DRV_ALSA* drv, UINT32 dataSize, void* data)
{
	int retVal;
	
	do
	{
		retVal = snd_pcm_writei(drv->hPCM, data, dataSize / drv->waveFmt.nBlockAlign);
	} while (retVal == -EAGAIN);
	if (retVal == -ESTRPIPE)
	{
		retVal = snd_pcm_resume(drv->hPCM);
		while(retVal == -EAGAIN)
		{
			Sleep(1);
			retVal = snd_pcm_resume(drv->hPCM);
		}
		if (retVal < 0)
			retVal = -EPIPE;
	}
	if (retVal == -EPIPE)
	{
		// buffer underrun
		snd_pcm_prepare(drv->hPCM);
	}
	
	return AERR_OK;
}